

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O0

bool __thiscall
JitFFI::SysV64::ArgOPList::do_next
          (ArgOPList *this,function<void_(JitFFI::SysV64::ArgTypeInfo::OP,_unsigned_int)> *f)

{
  bool bVar1;
  undefined1 local_2c [7];
  bool v;
  Data data;
  function<void_(JitFFI::SysV64::ArgTypeInfo::OP,_unsigned_int)> *f_local;
  ArgOPList *this_local;
  
  data._4_8_ = f;
  bVar1 = StackList<JitFFI::SysV64::ArgOPList::Data>::get_next(&this->datalist,(Data *)local_2c);
  if (bVar1) {
    std::function<void_(JitFFI::SysV64::ArgTypeInfo::OP,_unsigned_int)>::operator()
              ((function<void_(JitFFI::SysV64::ArgTypeInfo::OP,_unsigned_int)> *)data._4_8_,
               local_2c[0],data._0_4_);
  }
  return bVar1;
}

Assistant:

bool do_next(const std::function<void(ArgTypeInfo::OP, unsigned int num)> &f) {
				Data data;
				bool v = datalist.get_next(data);
				if (v == false)
					return false;
				f(data.op, data.num);
				return true;
			}